

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberValidator.h
# Opt level: O1

string * __thiscall
cursespp::NumberValidator<double>::ErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,NumberValidator<double> *this)

{
  ulong uVar1;
  long *local_80;
  char *local_78;
  long local_70 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  double local_40;
  double local_38;
  double local_30;
  
  local_30 = this->minimum;
  local_38 = this->maximum;
  f8n::i18n::Locale::Instance();
  if (((local_30 == 2.2250738585072014e-308) && (!NAN(local_30))) ||
     ((local_38 == 1.79769313486232e+308 && (!NAN(local_38))))) {
    f8n::i18n::Locale::Translate_abi_cxx11_((char *)__return_storage_ptr__);
  }
  else {
    f8n::i18n::Locale::Translate_abi_cxx11_((char *)__return_storage_ptr__);
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"{{minimum}}","");
    local_40 = this->minimum;
    if ((this->formatter).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->formatter)._M_invoker)(&local_60,(_Any_data *)&this->formatter,&local_40);
    for (uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_80,0);
        uVar1 != 0xffffffffffffffff;
        uVar1 = std::__cxx11::string::find
                          ((char *)__return_storage_ptr__,(ulong)local_80,
                           uVar1 + local_60._M_string_length)) {
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,uVar1,local_78,(ulong)local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"{{maximum}}","");
    local_40 = this->maximum;
    if ((this->formatter).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->formatter)._M_invoker)(&local_60,(_Any_data *)&this->formatter,&local_40);
    for (uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)local_80,0);
        uVar1 != 0xffffffffffffffff;
        uVar1 = std::__cxx11::string::find
                          ((char *)__return_storage_ptr__,(ulong)local_80,
                           uVar1 + local_60._M_string_length)) {
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,uVar1,local_78,(ulong)local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string ErrorMessage() const override {
            if (bounded(minimum, maximum)) {
                std::string result = _TSTR("validator_dialog_number_parse_bounded_error");
                f8n::str::replace(result, "{{minimum}}", formatter(minimum));
                f8n::str::replace(result, "{{maximum}}", formatter(maximum));
                return result;
            }
            return _TSTR("validator_dialog_number_parse_error");
        }